

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::emit_local_masked_variable
          (CompilerMSL *this,SPIRVariable *masked_var,bool strip_array)

{
  uint32_t uVar1;
  size_t sVar2;
  int iVar3;
  SPIRFunction *pSVar4;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  pSVar4 = Variant::get<spirv_cross::SPIRFunction>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  iVar3 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1c])(this,masked_var,4);
  if (((char)iVar3 == '\0') || ((this->msl_options).multi_patch_workgroup != true)) {
    uVar1 = (masked_var->super_IVariant).self.id;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::reserve
              (&pSVar4->local_variables,
               (pSVar4->local_variables).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size + 1);
    sVar2 = (pSVar4->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>
            .buffer_size;
    (pSVar4->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr
    [sVar2].id = uVar1;
    (pSVar4->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
    buffer_size = sVar2 + 1;
  }
  else {
    pcStack_40 = ::std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3677:39)>
                 ::_M_invoke;
    local_48 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3677:39)>
               ::_M_manager;
    local_58._M_unused._M_object = this;
    local_58._8_8_ = masked_var;
    SmallVector<std::function<void_()>,_0UL>::push_back
              (&pSVar4->fixup_hooks_in,(function<void_()> *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  }
  if ((char)iVar3 == '\0') {
    uVar1 = (masked_var->super_IVariant).self.id;
    SmallVector<unsigned_int,_8UL>::reserve
              (&this->vars_needing_early_declaration,
               (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size + 1
              );
    sVar2 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size;
    (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr[sVar2] = uVar1;
    (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size = sVar2 + 1;
  }
  else {
    uVar1 = (masked_var->initializer).id;
    if (uVar1 != 0) {
      if (strip_array) {
        local_48 = (code *)0x0;
        pcStack_40 = (code *)0x0;
        local_58._M_unused._M_object = (void *)0x0;
        local_58._8_8_ = 0;
        local_58._M_unused._M_object = operator_new(0x18);
        *(CompilerMSL **)local_58._M_unused._0_8_ = this;
        *(SPIRVariable **)((long)local_58._M_unused._0_8_ + 8) = masked_var;
        *(uint32_t *)((long)local_58._M_unused._0_8_ + 0x10) = uVar1;
        pcStack_40 = ::std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3719:40)>
                     ::_M_invoke;
        local_48 = ::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3719:40)>
                   ::_M_manager;
        SmallVector<std::function<void_()>,_0UL>::push_back
                  (&pSVar4->fixup_hooks_in,(function<void_()> *)&local_58);
        if (local_48 != (code *)0x0) {
          (*local_48)(&local_58,&local_58,__destroy_functor);
        }
      }
      else {
        local_48 = (code *)0x0;
        pcStack_40 = (code *)0x0;
        local_58._M_unused._M_object = (void *)0x0;
        local_58._8_8_ = 0;
        local_58._M_unused._M_object = operator_new(0x18);
        *(CompilerMSL **)local_58._M_unused._0_8_ = this;
        *(SPIRVariable **)((long)local_58._M_unused._0_8_ + 8) = masked_var;
        *(uint32_t *)((long)local_58._M_unused._0_8_ + 0x10) = uVar1;
        pcStack_40 = ::std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3729:40)>
                     ::_M_invoke;
        local_48 = ::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:3729:40)>
                   ::_M_manager;
        SmallVector<std::function<void_()>,_0UL>::push_back
                  (&pSVar4->fixup_hooks_in,(function<void_()> *)&local_58);
        if (local_48 != (code *)0x0) {
          (*local_48)(&local_58,&local_58,__destroy_functor);
        }
      }
    }
  }
  return;
}

Assistant:

void CompilerMSL::emit_local_masked_variable(const SPIRVariable &masked_var, bool strip_array)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	bool threadgroup_storage = variable_decl_is_remapped_storage(masked_var, StorageClassWorkgroup);

	if (threadgroup_storage && msl_options.multi_patch_workgroup)
	{
		// We need one threadgroup block per patch, so fake this.
		entry_func.fixup_hooks_in.push_back([this, &masked_var]() {
			auto &type = get_variable_data_type(masked_var);
			add_local_variable_name(masked_var.self);

			const uint32_t max_control_points_per_patch = 32u;
			uint32_t max_num_instances =
					(max_control_points_per_patch + get_entry_point().output_vertices - 1u) /
					get_entry_point().output_vertices;
			statement("threadgroup ", type_to_glsl(type), " ",
			          "spvStorage", to_name(masked_var.self), "[", max_num_instances, "]",
			          type_to_array_glsl(type, 0), ";");

			// Assign a threadgroup slice to each PrimitiveID.
			// We assume here that workgroup size is rounded to 32,
			// since that's the maximum number of control points per patch.
			// We cannot size the array based on fixed dispatch parameters,
			// since Metal does not allow that. :(
			// FIXME: We will likely need an option to support passing down target workgroup size,
			// so we can emit appropriate size here.
			statement("threadgroup auto ",
			          "&", to_name(masked_var.self),
			          " = spvStorage", to_name(masked_var.self), "[",
			          "(", to_expression(builtin_invocation_id_id), ".x / ",
			          get_entry_point().output_vertices, ") % ",
			          max_num_instances, "];");
		});
	}
	else
	{
		entry_func.add_local_variable(masked_var.self);
	}

	if (!threadgroup_storage)
	{
		vars_needing_early_declaration.push_back(masked_var.self);
	}
	else if (masked_var.initializer)
	{
		// Cannot directly initialize threadgroup variables. Need fixup hooks.
		ID initializer = masked_var.initializer;
		if (strip_array)
		{
			entry_func.fixup_hooks_in.push_back([this, &masked_var, initializer]() {
				auto invocation = to_tesc_invocation_id();
				statement(to_expression(masked_var.self), "[",
				          invocation, "] = ",
				          to_expression(initializer), "[",
				          invocation, "];");
			});
		}
		else
		{
			entry_func.fixup_hooks_in.push_back([this, &masked_var, initializer]() {
				statement(to_expression(masked_var.self), " = ", to_expression(initializer), ";");
			});
		}
	}
}